

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall wabt::Var::set_name(Var *this,string_view name)

{
  allocator<char> local_41;
  string local_40;
  Var *local_20;
  Var *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Var *)name._M_len;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_41);
  set_name(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void Var::set_name(std::string_view name) {
  set_name(std::string(name));
}